

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigAddClass(Ivy_FraigList_t *pList,Ivy_Obj_t *pClass)

{
  Ivy_Obj_t *pIVar1;
  
  if (pList->pHead == (Ivy_Obj_t *)0x0) {
    pList->pHead = pClass;
    pIVar1 = (Ivy_Obj_t *)0x0;
  }
  else {
    pIVar1 = pList->pTail;
    pIVar1->pPrevFan0 = pClass;
  }
  pList->pTail = pClass;
  pClass->pPrevFan1 = pIVar1;
  pClass->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

void Ivy_FraigAddClass( Ivy_FraigList_t * pList, Ivy_Obj_t * pClass )
{
    if ( pList->pHead == NULL )
    {
        pList->pHead = pClass;
        pList->pTail = pClass;
        Ivy_ObjSetEquivListPrev( pClass, NULL );
        Ivy_ObjSetEquivListNext( pClass, NULL ); 
    }
    else
    {
        Ivy_ObjSetEquivListNext( pList->pTail, pClass ); 
        Ivy_ObjSetEquivListPrev( pClass, pList->pTail );
        Ivy_ObjSetEquivListNext( pClass, NULL ); 
        pList->pTail = pClass;
    }
    pList->nItems++;
}